

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O0

void __thiscall cpp_client::Base_game::set_ai_parameters(Base_game *this,string *params)

{
  ulong uVar1;
  char *pcVar2;
  Input_error *pIVar3;
  long lVar4;
  pointer pBVar5;
  mapped_type *this_00;
  int local_154;
  string local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  key_type local_130 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  char local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  long local_88;
  size_type eq_loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> to_parse;
  size_type new_split;
  int split;
  string local_40 [32];
  unique_ptr<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_> local_20;
  string *local_18;
  string *params_local;
  Base_game *this_local;
  
  local_18 = params;
  params_local = (string *)this;
  (*(this->super_Delta_mergable)._vptr_Delta_mergable[0xb])(&local_20);
  std::unique_ptr<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>::operator=
            (&this->ai_,&local_20);
  std::unique_ptr<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>::~unique_ptr
            (&local_20);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar2 == '&') {
      pIVar3 = (Input_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Can not begin AI settings string with &, string was:\n");
      Input_error::runtime_error(pIVar3,local_40);
      __cxa_throw(pIVar3,&Input_error::typeinfo,Input_error::~Input_error);
    }
    do {
      lVar4 = std::__cxx11::string::find((char)local_18,0x26);
      std::__cxx11::string::substr((ulong)&eq_loc,(ulong)local_18);
      local_88 = std::__cxx11::string::find((char)&eq_loc,0x3d);
      if (local_88 == -1) {
        pIVar3 = (Input_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Could not parse the AI settings string:\n");
        std::operator+(local_e8,local_108);
        std::operator+(local_c8,local_e8);
        std::operator+(local_a8,(char *)local_c8);
        Input_error::runtime_error(pIVar3,local_a8);
        __cxa_throw(pIVar3,&Input_error::typeinfo,Input_error::~Input_error);
      }
      std::__cxx11::string::substr((ulong)local_130,(ulong)&eq_loc);
      std::__cxx11::string::substr((ulong)local_150,(ulong)&eq_loc);
      pBVar5 = std::unique_ptr<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>::
               operator->(&this->ai_);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&pBVar5->passed_params_,local_130);
      std::__cxx11::string::operator=((string *)this_00,local_150);
      if (lVar4 == -1) {
        local_154 = 3;
      }
      else {
        local_154 = 0;
      }
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)&eq_loc);
    } while (local_154 == 0);
  }
  return;
}

Assistant:

void Base_game::set_ai_parameters(const std::string& params)
{
   ai_ = generate_ai();
   // this simplifies code a lot
   if(params.empty())
   {
      return;
   }
   // error on leading ampersands
   if(params[0] == '&')
   {
      throw Input_error("Can not begin AI settings string with &, string was:\n" +
                        params);
   }
   auto split = 0;
   while(true)
   {
      const auto new_split = params.find('&', split + 1);
      const auto to_parse = params.substr(split, new_split - split);
      const auto eq_loc = to_parse.find('=');
      if(eq_loc == params.npos)
      {
         throw Input_error("Could not parse the AI settings string:\n" +
                           params + "\n"
                           "In particular, could not find '=' in \"" + to_parse + "\"");
      }
      const auto key = to_parse.substr(0, eq_loc);
      const auto value = to_parse.substr(eq_loc + 1, std::string::npos);
      ai_->passed_params_[key] = value;
      if(new_split == std::string::npos)
      {
         break;
      }
      split = new_split + 1;
   }
}